

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initialalignment.cpp
# Opt level: O3

bool __thiscall Alignment::CalculateMean(Alignment *this)

{
  Vector3d *pVVar1;
  double dVar2;
  pointer pMVar3;
  pointer pMVar4;
  bool bVar5;
  ostream *poVar6;
  pointer pMVar7;
  bool bVar8;
  long lVar9;
  double dVar10;
  double dVar13;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  lVar9 = 0;
  bVar5 = true;
  do {
    bVar8 = bVar5;
    this->Mean[lVar9].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = 0.0;
    this->Mean[lVar9].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = 0.0;
    this->Mean[lVar9].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[2] = 0.0;
    pVVar1 = this->Mean + lVar9;
    pMVar3 = this->OriginData[lVar9].
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar4 = this->OriginData[lVar9].
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pMVar3 == pMVar4) {
      dVar2 = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[2];
    }
    else {
      dVar10 = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[0];
      dVar13 = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[1];
      dVar2 = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[2];
      pMVar7 = pMVar3;
      do {
        dVar10 = dVar10 + (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                          m_storage.m_data.array[0];
        dVar13 = dVar13 + (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                          m_storage.m_data.array[1];
        dVar2 = dVar2 + (pMVar7->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data.array[2];
        (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
        array[0] = dVar10;
        (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
        array[1] = dVar13;
        (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
        array[2] = dVar2;
        pMVar7 = pMVar7 + 1;
      } while (pMVar7 != pMVar4);
    }
    lVar9 = ((long)pMVar4 - (long)pMVar3 >> 3) * -0x5555555555555555;
    auVar11._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar11._0_8_ = lVar9;
    auVar11._12_4_ = 0x45300000;
    dVar10 = (auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0);
    auVar12._8_8_ = dVar10;
    auVar12._0_8_ = dVar10;
    auVar12 = divpd(*(undefined1 (*) [16])
                     (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                     m_storage.m_data.array,auVar12);
    *(undefined1 (*) [16])
     (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array =
         auVar12;
    (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2]
         = dVar2 / dVar10;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    lVar9 = 1;
    bVar5 = false;
  } while (bVar8);
  return true;
}

Assistant:

bool Alignment::CalculateMean()
{
    for(int i = 0; i < 2; ++i)
    {
        this->Mean[i] = Vector3d::Zero();
        try
        {
            for(auto data : this->OriginData[i])
            {
                this->Mean[i][0] += (data[0]);
                this->Mean[i][1] += (data[1]);
                this->Mean[i][2] += (data[2]);
            }
            this->Mean[i] /= this->OriginData[i].size();
            cout << OriginData[i].size() << endl; 
        }
        catch(const std::exception& e)
        {
            std::cout << e.what() << '\n';
            return false;
        }
    }
    return true;
}